

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::init
          (TextureBufferFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *str;
  ostringstream *this_00;
  deUint32 internalFormat;
  TextureFormat TVar1;
  ContextInfo *pCVar2;
  RenderContext *context;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  MessageBuilder *this_01;
  TextureBuffer *this_02;
  NotSupportedError *this_03;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat fmt;
  LogGradientFmt local_208;
  Enum<int,_2UL> local_1f8;
  TextureFormatInfo spec;
  undefined1 local_1a8 [384];
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  fmt = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo(&spec,&fmt);
  colorA.m_data[0] = spec.valueMin.m_data[0];
  colorA.m_data[1] = spec.valueMax.m_data[1];
  colorA.m_data[2] = spec.valueMin.m_data[2];
  colorA.m_data[3] = spec.valueMax.m_data[3];
  colorB.m_data[0] = spec.valueMax.m_data[0];
  colorB.m_data[1] = spec.valueMin.m_data[1];
  colorB.m_data[2] = spec.valueMax.m_data[2];
  colorB.m_data[3] = spec.valueMin.m_data[3];
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_texture_buffer");
    if (!bVar3) {
      bVar3 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
      if (!bVar3) {
        this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_03,"Texture buffers not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                   ,299);
        goto LAB_0129a668;
      }
    }
  }
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  iVar4 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8c2b);
  this->m_maxTextureBufferSize = iVar4;
  if (0 < iVar4) {
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = TVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Buffer texture, ");
    local_1f8.m_value = this->m_format;
    local_1f8.m_getName = glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", ");
    this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&this->m_width);
    str = &this_01->m_str;
    std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,",\n  fill with ");
    local_208.valueMin = &colorA;
    local_208.valueMax = &colorB;
    glu::TextureTestUtil::operator<<
              (&str->super_basic_ostream<char,_std::char_traits<char>_>,&local_208);
    std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>," gradient");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_02 = (TextureBuffer *)operator_new(0x38);
    context = this->m_renderCtx;
    internalFormat = this->m_format;
    iVar4 = this->m_width;
    iVar5 = tcu::TextureFormat::getPixelSize(&fmt);
    glu::TextureBuffer::TextureBuffer(this_02,context,internalFormat,(long)(iVar5 * iVar4));
    this->m_texture = this_02;
    glu::TextureBuffer::getFullRefTexture((PixelBufferAccess *)local_1a8,this_02);
    tcu::fillWithComponentGradients((PixelBufferAccess *)local_1a8,&colorA,&colorB);
    return extraout_EAX;
  }
  this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_03,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
             ,0x131);
LAB_0129a668:
  __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferFormatCase::init (void)
{
	TestLog&				log				= m_testCtx.getLog();
	tcu::TextureFormat		fmt				= glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(fmt);
	tcu::Vec4				colorA			(spec.valueMin.x(), spec.valueMax.y(), spec.valueMin.z(), spec.valueMax.w());
	tcu::Vec4				colorB			(spec.valueMax.x(), spec.valueMin.y(), spec.valueMax.z(), spec.valueMin.w());
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32
		&& !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_buffer")
		&& !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"))
	{
		TCU_THROW(NotSupportedError, "Texture buffers not supported");
	}

	m_maxTextureBufferSize = m_context.getContextInfo().getInt(GL_MAX_TEXTURE_BUFFER_SIZE);

	if (m_maxTextureBufferSize <= 0)
		TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");

	log << TestLog::Message << "Buffer texture, " << glu::getTextureFormatStr(m_format) << ", " << m_width
							<< ",\n  fill with " << formatGradient(&colorA, &colorB) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new glu::TextureBuffer(m_renderCtx, m_format, m_width * fmt.getPixelSize());

	// Fill level 0.
	tcu::fillWithComponentGradients(m_texture->getFullRefTexture(), colorA, colorB);
}